

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLFileData.h
# Opt level: O1

void __thiscall
Assimp::MDL::IntSplitGroupData_MDL7::~IntSplitGroupData_MDL7(IntSplitGroupData_MDL7 *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  pointer puVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this->aiSplit != (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x0) {
    if ((this->shared->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->shared->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar4 = 0;
      uVar5 = 1;
      do {
        pvVar1 = this->aiSplit[uVar4];
        if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2,(long)(pvVar1->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)puVar2);
          }
          operator_delete(pvVar1,0x18);
        }
        bVar3 = uVar5 < (ulong)((long)(this->shared->pcMats).
                                      super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->shared->pcMats).
                                      super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar3);
    }
    if (this->aiSplit != (vector<unsigned_int,_std::allocator<unsigned_int>_> **)0x0) {
      operator_delete__(this->aiSplit);
      return;
    }
  }
  return;
}

Assistant:

~IntSplitGroupData_MDL7()
    {
        // kill all face lists
        if(this->aiSplit)
        {
            for (unsigned int m = 0; m < shared.pcMats.size();++m)
                delete this->aiSplit[m];
            delete[] this->aiSplit;
        }
    }